

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall
otherEqUnits_degreeBaume_Test::~otherEqUnits_degreeBaume_Test(otherEqUnits_degreeBaume_Test *this)

{
  otherEqUnits_degreeBaume_Test *this_local;
  
  ~otherEqUnits_degreeBaume_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(otherEqUnits, degreeBaume)
{
    auto degBL = precise::special::degreeBaumeLight;
    EXPECT_NEAR(convert(10, degBL, precise::g / precise::mL), 1.0000, 0.0001);
    EXPECT_NEAR(convert(1.0000, precise::g / precise::mL, degBL), 10.0, 0.001);
    EXPECT_NEAR(convert(26.075, degBL, precise::g / precise::mL), 0.897, 0.001);
    EXPECT_NEAR(convert(0.897, precise::g / precise::mL, degBL), 26.075, 0.001);
    EXPECT_NEAR(convert(43.91, degBL, precise::g / precise::mL), 0.805, 0.001);
    EXPECT_NEAR(convert(0.805, precise::g / precise::mL, degBL), 43.91, 0.01);

    auto degBH = precise::special::degreeBaumeHeavy;
    EXPECT_NEAR(convert(0, degBH, precise::g / precise::mL), 1.0000, 0.0001);
    EXPECT_NEAR(convert(1.0000, precise::g / precise::mL, degBH), 0.0, 0.001);
    EXPECT_NEAR(convert(15.0, degBH, precise::g / precise::mL), 1.115, 0.001);
    EXPECT_NEAR(convert(1.115, precise::g / precise::mL, degBH), 14.955, 0.001);
    EXPECT_NEAR(convert(69.0, degBH, precise::g / precise::mL), 1.908, 0.001);
    EXPECT_NEAR(convert(1.908, precise::g / precise::mL, degBH), 69.0, 0.005);
}